

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

Vec_Int_t * Mop_ManCompatiblePairs(Vec_Int_t *vPairs,int nObjs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *vPairsNew;
  Vec_Int_t *vCounts;
  int Entry2;
  int Entry;
  int i;
  int nObjs_local;
  Vec_Int_t *vPairs_local;
  
  p = Vec_IntStart(nObjs);
  iVar1 = Vec_IntSize(vPairs);
  p_00 = Vec_IntAlloc(iVar1);
  for (Entry2 = 0; iVar1 = Vec_IntSize(vPairs), Entry2 < iVar1; Entry2 = Entry2 + 1) {
    iVar1 = Vec_IntEntry(vPairs,Entry2);
    Vec_IntAddToEntry(p,iVar1,1);
  }
  for (Entry2 = 0; iVar1 = Vec_IntSize(vPairs), Entry2 + 1 < iVar1; Entry2 = Entry2 + 2) {
    iVar1 = Vec_IntEntry(vPairs,Entry2);
    iVar2 = Vec_IntEntry(vPairs,Entry2 + 1);
    iVar3 = Vec_IntEntry(p,iVar1);
    if ((iVar3 == 1) || (iVar3 = Vec_IntEntry(p,iVar2), iVar3 == 1)) {
      iVar3 = Vec_IntEntry(p,iVar1);
      if (iVar3 == 1) {
        Vec_IntPushTwo(p_00,iVar1,iVar2);
      }
      else {
        Vec_IntPushTwo(p_00,iVar2,iVar1);
      }
      Vec_IntWriteEntry(p,iVar1,-1);
      Vec_IntWriteEntry(p,iVar2,-1);
    }
  }
  for (Entry2 = 0; iVar1 = Vec_IntSize(vPairs), Entry2 + 1 < iVar1; Entry2 = Entry2 + 2) {
    iVar1 = Vec_IntEntry(vPairs,Entry2);
    iVar2 = Vec_IntEntry(vPairs,Entry2 + 1);
    iVar3 = Vec_IntEntry(p,iVar1);
    if ((0 < iVar3) && (iVar3 = Vec_IntEntry(p,iVar2), 0 < iVar3)) {
      Vec_IntPushTwo(p_00,iVar1,iVar2);
      Vec_IntWriteEntry(p,iVar1,-1);
      Vec_IntWriteEntry(p,iVar2,-1);
    }
  }
  for (Entry2 = 0; iVar1 = Vec_IntSize(vPairs), Entry2 + 1 < iVar1; Entry2 = Entry2 + 2) {
    iVar1 = Vec_IntEntry(vPairs,Entry2);
    iVar2 = Vec_IntEntry(vPairs,Entry2 + 1);
    iVar3 = Vec_IntEntry(p,iVar1);
    if ((0 < iVar3) || (iVar3 = Vec_IntEntry(p,iVar2), 0 < iVar3)) {
      iVar3 = Vec_IntEntry(p,iVar1);
      if (iVar3 < 1) {
        Vec_IntPushTwo(p_00,iVar2,iVar1);
      }
      else {
        Vec_IntPushTwo(p_00,iVar1,iVar2);
      }
      Vec_IntWriteEntry(p,iVar1,-1);
      Vec_IntWriteEntry(p,iVar2,-1);
    }
  }
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Int_t * Mop_ManCompatiblePairs( Vec_Int_t * vPairs, int nObjs )
{
    int i, Entry, Entry2;
    Vec_Int_t * vCounts = Vec_IntStart( nObjs );
    Vec_Int_t * vPairsNew = Vec_IntAlloc( Vec_IntSize(vPairs) );
    Vec_IntForEachEntry( vPairs, Entry, i )
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    // include pairs which have those that appear only once
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) == 1 || Vec_IntEntry(vCounts, Entry2) == 1 )
        {
            if ( Vec_IntEntry(vCounts, Entry) == 1 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add those remaining pairs that are both present
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 && Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    // add remaining pairs
    Vec_IntForEachEntryDouble( vPairs, Entry, Entry2, i )
        if ( Vec_IntEntry(vCounts, Entry) > 0 || Vec_IntEntry(vCounts, Entry2) > 0 )
        {
            if ( Vec_IntEntry(vCounts, Entry) > 0 )
                Vec_IntPushTwo( vPairsNew, Entry, Entry2 );
            else
                Vec_IntPushTwo( vPairsNew, Entry2, Entry );
            Vec_IntWriteEntry( vCounts, Entry, -1 );
            Vec_IntWriteEntry( vCounts, Entry2, -1 );
        }
    Vec_IntFree( vCounts );
    // verify the result
    if ( 0 )
    {
        Vec_Int_t * vTemp1 = Vec_IntDup( vPairs );
        Vec_Int_t * vTemp2 = Vec_IntDup( vPairsNew );
        Vec_IntUniqify( vTemp1 );
        Vec_IntUniqify( vTemp2 );
        assert( Vec_IntEqual( vTemp1, vTemp2 ) );
        Vec_IntFree( vTemp1 );
        Vec_IntFree( vTemp2 );
    }
    return vPairsNew;
}